

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall wirehair::Codec::SolveMatrix(Codec *this)

{
  bool bVar1;
  WirehairResult WVar2;
  
  GreedyPeeling(this);
  bVar1 = AllocateMatrix(this);
  WVar2 = Wirehair_OOM;
  if (bVar1) {
    SetDeferredColumns(this);
    SetMixingColumnsForDeferredRows(this);
    PeelDiagonal(this);
    CopyDeferredRows(this);
    MultiplyDenseRows(this);
    SetHeavyRows(this);
    AddInvertibleGF2Matrix
              (this->_ge_matrix,(uint)this->_defer_count,this->_ge_pitch,(uint)this->_dense_count);
    SetupTriangle(this);
    bVar1 = Triangle(this);
    WVar2 = (WirehairResult)!bVar1;
  }
  return WVar2;
}

Assistant:

WirehairResult Codec::SolveMatrix()
{
    // (1) Peeling

    GreedyPeeling();

    CAT_IF_DUMP( PrintPeeled(); )
    CAT_IF_DUMP( PrintDeferredRows(); )
    CAT_IF_DUMP( PrintDeferredColumns(); )

    // (2) Compression

    if (!AllocateMatrix()) {
        return Wirehair_OOM;
    }

    SetDeferredColumns();
    SetMixingColumnsForDeferredRows();
    PeelDiagonal();
    CopyDeferredRows();
    MultiplyDenseRows();
    SetHeavyRows();

    // Add invertible matrix to mathematically tie dense rows to dense mixing columns
    AddInvertibleGF2Matrix(_ge_matrix, _defer_count, _ge_pitch, _dense_count);

#if defined(CAT_DUMP_CODEC_DEBUG) || defined(CAT_DUMP_GE_MATRIX)
    cout << "After Compress:" << endl;
    PrintGEMatrix();
#endif
    CAT_IF_DUMP( PrintCompressMatrix(); )

    // (3) Gaussian Elimination

    SetupTriangle();

    if (!Triangle())
    {
        CAT_IF_DUMP( cout << "After Triangle FAILED:" << endl; )
        CAT_IF_DUMP( PrintGEMatrix(); )
        CAT_IF_DUMP( PrintExtraMatrix(); )

        return Wirehair_NeedMore;
    }

#if defined(CAT_DUMP_CODEC_DEBUG) || defined(CAT_DUMP_GE_MATRIX)
    cout << "After Triangle:" << endl;
    PrintGEMatrix();
    PrintExtraMatrix();
#endif

    return Wirehair_Success;
}